

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O2

void __thiscall
vkt::texture::SampleVerifier::fetchTexel
          (SampleVerifier *this,IVec3 *coordIn,int layer,int level,VkFilter filter,Vec4 *resultMin,
          Vec4 *resultMax)

{
  ImgDim IVar1;
  int iVar2;
  VkBorderColor VVar3;
  bool bVar4;
  deInt32 dVar5;
  float *pfVar6;
  pointer pCVar7;
  long lVar8;
  bool bVar9;
  long lVar10;
  int ndx;
  Vec4 *this_00;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  IVec3 coord;
  undefined1 *local_c8;
  VkSamplerAddressMode local_c0;
  IVec2 newCoord;
  IVec2 IStack_b0;
  IVec2 local_a8;
  Vec4 *local_a0;
  undefined1 local_98 [20];
  int faces [3];
  Vec4 cornerTexels [3];
  int newFace;
  
  tcu::Vector<int,_3>::Vector(&coord,coordIn);
  local_c8 = *(undefined1 **)&this->m_samplerParams->wrappingModeU;
  local_c0 = this->m_samplerParams->wrappingModeW;
  bVar4 = ::vk::isSrgbFormat(this->m_imParams->format);
  IVar1 = this->m_imParams->dim;
  if (filter != VK_FILTER_LINEAR || IVar1 != IMG_DIM_CUBE) {
    if (IVar1 == IMG_DIM_CUBE) {
      local_c0 = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
      local_c8 = &DAT_200000002;
    }
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      dVar5 = util::wrapTexelCoord
                        (coord.m_data[lVar10],
                         (this->m_levels->
                         super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[lVar10],
                         *(VkSamplerAddressMode *)((long)&local_c8 + lVar10 * 4));
      coord.m_data[lVar10] = dVar5;
    }
    goto LAB_0076d07e;
  }
  faces[0] = layer % 6;
  if (-1 < coord.m_data[0]) {
    iVar2 = (this->m_levels->
            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
            )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[0];
    bVar9 = iVar2 <= coord.m_data[0];
    if (coord.m_data[1] < 0) {
      bVar9 = true;
      if (iVar2 <= coord.m_data[0]) {
LAB_0076d03e:
        if (coord.m_data[0] <
            (this->m_levels->
            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
            )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[0]) goto LAB_0076d07e;
        if (!bVar9) goto LAB_0076d066;
        goto LAB_0076d057;
      }
      pCVar7 = (this->m_levels->
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    else {
LAB_0076cf9e:
      pCVar7 = (this->m_levels->
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (bVar9 == pCVar7[level].m_size.m_data[1] <= coord.m_data[1]) {
        if (-1 < coord.m_data[0]) {
          bVar9 = false;
          goto LAB_0076d03e;
        }
LAB_0076d066:
        pCVar7 = (this->m_levels->
                 super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pCVar7[level].m_size.m_data[1] <= coord.m_data[1]) goto LAB_0076d113;
        goto LAB_0076d07e;
      }
    }
    newCoord.m_data[0] = 0;
    newCoord.m_data[1] = 0;
    newFace = 0;
    local_98._0_4_ = pCVar7[level].m_size.m_data[0];
    local_98._4_4_ = pCVar7[level].m_size.m_data[1];
    util::wrapCubemapEdge((IVec2 *)cornerTexels,(IVec2 *)local_98,faces[0],&newCoord,&newFace);
    cornerTexels[0].m_data._0_8_ = &coord;
    cornerTexels[0].m_data[2] = 0.0;
    cornerTexels[0].m_data[3] = 1.4013e-45;
    tcu::VecAccess<int,_3,_2>::operator=((VecAccess<int,_3,_2> *)cornerTexels,&newCoord);
    layer = (layer / 6) * 6 + newFace;
LAB_0076d07e:
    if ((((-1 < coord.m_data[0]) &&
         (pCVar7 = (this->m_levels->
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   )._M_impl.super__Vector_impl_data._M_start,
         coord.m_data[0] < pCVar7[level].m_size.m_data[0])) && (-1 < coord.m_data[1])) &&
       (((coord.m_data[1] < pCVar7[level].m_size.m_data[1] && (-1 < coord.m_data[2])) &&
        (coord.m_data[2] < pCVar7[level].m_size.m_data[2])))) {
      fetchTexelWrapped(this,&coord,layer,level,resultMin,resultMax);
      return;
    }
    VVar3 = this->m_samplerParams->borderColor;
    if (VVar3 == VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE) {
      fVar11 = 1.0;
      fVar12 = 1.0;
      fVar13 = 1.0;
      fVar14 = 1.0;
    }
    else if (VVar3 == VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK) {
      fVar11 = 0.0;
      fVar12 = 0.0;
      fVar13 = 0.0;
      fVar14 = 1.0;
    }
    else {
      if (VVar3 != VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK) {
        return;
      }
      fVar11 = 0.0;
      fVar12 = 0.0;
      fVar13 = 0.0;
      fVar14 = 0.0;
    }
    resultMin->m_data[0] = fVar11;
    resultMin->m_data[1] = fVar12;
    resultMin->m_data[2] = fVar13;
    resultMin->m_data[3] = fVar14;
    resultMax->m_data[0] = fVar11;
    resultMax->m_data[1] = fVar12;
    resultMax->m_data[2] = fVar13;
    resultMax->m_data[3] = fVar14;
    return;
  }
  bVar9 = true;
  if (-1 < coord.m_data[1]) goto LAB_0076cf9e;
LAB_0076d057:
  pCVar7 = (this->m_levels->
           super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
           )._M_impl.super__Vector_impl_data._M_start;
LAB_0076d113:
  faces[1] = 0;
  faces[2] = 0;
  newCoord.m_data[0] = 0;
  newCoord.m_data[1] = 0;
  IStack_b0.m_data[0] = 0;
  IStack_b0.m_data[1] = 0;
  local_a8.m_data[0] = 0;
  local_a8.m_data[1] = 0;
  this_00 = cornerTexels;
  local_98._0_4_ = pCVar7[level].m_size.m_data[0];
  local_98._4_4_ = pCVar7[level].m_size.m_data[1];
  local_a0 = resultMin;
  util::wrapCubemapCorner
            ((IVec2 *)this_00,(IVec2 *)local_98,faces[0],faces + 1,faces + 2,&newCoord,&IStack_b0,
             &local_a8);
  lVar10 = 0;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)cornerTexels[0].m_data + lVar10));
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x30);
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    if (bVar4) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)&newFace,
                 (int)(this->m_levels->
                      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      )._M_impl.super__Vector_impl_data._M_start + level * 0x28,
                 (&newCoord)[lVar10].m_data[0],(&newCoord)[lVar10].m_data[1]);
      tcu::sRGBToLinear((tcu *)local_98,(Vec4 *)&newFace);
    }
    else {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_98,
                 (int)(this->m_levels->
                      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      )._M_impl.super__Vector_impl_data._M_start + level * 0x28,
                 (&newCoord)[lVar10].m_data[0],(&newCoord)[lVar10].m_data[1]);
    }
    tcu::Vector<float,_4>::operator+=(this_00,(Vector<float,_4> *)local_98);
    this_00 = this_00 + 1;
  }
  pfVar6 = cornerTexels[1].m_data;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    fVar11 = cornerTexels[0].m_data[lVar10];
    fVar12 = fVar11;
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 0x10) {
      fVar13 = *(float *)((long)pfVar6 + lVar8);
      fVar12 = (float)(~-(uint)(fVar13 <= fVar12) & (uint)fVar12 |
                      -(uint)(fVar13 <= fVar12) & (uint)fVar13);
      fVar11 = (float)(~-(uint)(fVar11 <= fVar13) & (uint)fVar11 |
                      (uint)fVar13 & -(uint)(fVar11 <= fVar13));
    }
    local_a0->m_data[lVar10] = fVar12;
    resultMax->m_data[lVar10] = fVar11;
    pfVar6 = pfVar6 + 1;
  }
  return;
}

Assistant:

void SampleVerifier::fetchTexel (const IVec3&	coordIn,
								 int			layer,
								 int			level,
								 VkFilter		filter,
								 Vec4&			resultMin,
								 Vec4&			resultMax) const
{
	IVec3 coord = coordIn;

	VkSamplerAddressMode wrappingModes[] =
	{
		m_samplerParams.wrappingModeU,
		m_samplerParams.wrappingModeV,
		m_samplerParams.wrappingModeW
	};

	const bool isSrgb = isSrgbFormat(m_imParams.format);

	// Wrapping operations


	if (m_imParams.dim == IMG_DIM_CUBE && filter == VK_FILTER_LINEAR)
	{
		// If the image is a cubemap and we are using linear filtering, we do edge or corner wrapping

		const int	arrayLayer = layer / 6;
		int			arrayFace  = layer % 6;

		if (coordOutOfRange(coord, 0, level) != coordOutOfRange(coord, 1, level))
		{
			// Wrap around edge

			IVec2	newCoord(0);
			int		newFace = 0;

			wrapCubemapEdge(coord.swizzle(0, 1),
							m_levels[level].getSize().swizzle(0, 1),
							arrayFace,
							newCoord,
							newFace);

			coord.xy()	= newCoord;
			layer		= arrayLayer * 6 + newFace;
		}
		else if (coordOutOfRange(coord, 0, level) && coordOutOfRange(coord, 1, level))
		{
			// Wrap corner

			int   faces[3] = {arrayFace, 0, 0};
			IVec2 cornerCoords[3];

			wrapCubemapCorner(coord.swizzle(0, 1),
							  m_levels[level].getSize().swizzle(0, 1),
							  arrayFace,
							  faces[1],
							  faces[2],
							  cornerCoords[0],
							  cornerCoords[1],
							  cornerCoords[2]);

			// \todo [2016-08-01 collinbaker] Call into fetchTexelWrapped instead

			Vec4 cornerTexels[3];

			for (int ndx = 0; ndx < 3; ++ndx)
			{
				int cornerLayer = faces[ndx] + arrayLayer * 6;

				if (isSrgb)
				{
				    cornerTexels[ndx] += sRGBToLinear(m_levels[level].getPixel(cornerCoords[ndx][0], cornerCoords[ndx][1], cornerLayer));
				}
				else
				{
					cornerTexels[ndx] += m_levels[level].getPixel(cornerCoords[ndx][0], cornerCoords[ndx][1], cornerLayer);
				}
			}

			for (int compNdx = 0; compNdx < 4; ++compNdx)
			{
				float compMin = cornerTexels[0][compNdx];
				float compMax = cornerTexels[0][compNdx];

				for (int ndx = 1; ndx < 3; ++ndx)
				{
					const float comp = cornerTexels[ndx][compNdx];

					compMin = de::min(comp, compMin);
					compMax = de::max(comp, compMax);
				}

				resultMin[compNdx] = compMin;
				resultMax[compNdx] = compMax;
			}

			return;
		}
		else
		{
			// If no wrapping is necessary, just do nothing
		}
	}
	else
	{
		// Otherwise, we do normal wrapping

		if (m_imParams.dim == IMG_DIM_CUBE)
		{
			wrappingModes[0] = wrappingModes[1] = wrappingModes[2] = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
		}

		for (int compNdx = 0; compNdx < 3; ++compNdx)
		{
			const int size = m_levels[level].getSize()[compNdx];

			coord[compNdx] = wrapTexelCoord(coord[compNdx], size, wrappingModes[compNdx]);
		}
	}

	if (coordOutOfRange(coord, 0, level) ||
		coordOutOfRange(coord, 1, level) ||
		coordOutOfRange(coord, 2, level))
	{
		// If after wrapping coordinates are still out of range, perform texel replacement

		switch (m_samplerParams.borderColor)
		{
			case VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK:
			{
				resultMin = Vec4(0.0f, 0.0f, 0.0f, 0.0f);
				resultMax = Vec4(0.0f, 0.0f, 0.0f, 0.0f);
				return;
			}
			case VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK:
			{
				resultMin = Vec4(0.0f, 0.0f, 0.0f, 1.0f);
				resultMax = Vec4(0.0f, 0.0f, 0.0f, 1.0f);
				return;
			}
			case VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE:
			{
				resultMin = Vec4(1.0f, 1.0f, 1.0f, 1.0f);
				resultMax = Vec4(1.0f, 1.0f, 1.0f, 1.0f);
				return;
			}
			default:
			{
				// \\ [2016-07-07 collinbaker] Handle
				// VK_BORDER_COLOR_INT_* borders
				DE_FATAL("Not implemented");
				break;
			}
		}
	}
	else
	{
		// Otherwise, actually fetch a texel

	    fetchTexelWrapped(coord, layer, level, resultMin, resultMax);
	}
}